

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alp.hpp
# Opt level: O3

bool duckdb::alp::AlpCompression<double,_true>::IsImpossibleToEncode(double n)

{
  undefined1 auVar1 [16];
  bool bVar2;
  uint uVar3;
  undefined8 unaff_RBX;
  ulong uVar4;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  
  auVar1._8_4_ = in_XMM0_Dc;
  auVar1._0_8_ = n;
  auVar1._12_4_ = in_XMM0_Dd;
  bVar2 = Value::IsFinite<double>(n);
  uVar4 = CONCAT71((int7)((ulong)unaff_RBX >> 8),1);
  if (bVar2) {
    bVar2 = Value::IsNan<double>(n);
    if (((-9.223372036854775e+18 <= n) && (n <= 9.223372036854775e+18)) && (!bVar2)) {
      if ((n != 0.0) || (NAN(n))) {
        uVar4 = 0;
      }
      else {
        uVar3 = movmskpd((int)uVar4,auVar1);
        uVar4 = (ulong)(uVar3 & 1);
      }
    }
  }
  return SUB81(uVar4,0);
}

Assistant:

static bool IsImpossibleToEncode(T n) {
		return !Value::IsFinite(n) || Value::IsNan(n) || n > AlpConstants::ENCODING_UPPER_LIMIT ||
		       n < AlpConstants::ENCODING_LOWER_LIMIT || (n == 0.0 && std::signbit(n)); //! Verification for -0.0
	}